

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O3

void __thiscall Assimp::LWO::Shader::~Shader(Shader *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->functionName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->functionName).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->ordinal)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->ordinal).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Shader()
        :   ordinal         ("\x00")
        ,   functionName    ("unknown")
        ,   enabled         (true)
    {}